

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O2

void __thiscall QTuioHandler::QTuioHandler(QTuioHandler *this,QString *specification)

{
  QUdpSocket *this_00;
  QTuioHandler *this_01;
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QDebug *pQVar6;
  QTuioHandler *pQVar7;
  QTransform *pQVar8;
  QPointingDevice *pQVar9;
  qsizetype qVar10;
  long lVar11;
  long lVar12;
  int i;
  ulong uVar13;
  CaseSensitivity CVar14;
  undefined8 *puVar15;
  QArrayDataPointer<char16_t> *pQVar16;
  QTuioHandler *pQVar17;
  long in_FS_OFFSET;
  byte bVar18;
  QLatin1StringView latin1;
  int local_108;
  int local_104;
  Object local_d8 [8];
  QDebug local_d0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<char16_t> local_88;
  char *local_70;
  long local_38;
  
  bVar18 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = 0;
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_00115840;
  *(undefined8 *)(this + 0x10) = 0;
  this_00 = (QUdpSocket *)(this + 0x18);
  QUdpSocket::QUdpSocket(this_00,(QObject *)0x0);
  this_01 = this + 0x68;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  puVar15 = &DAT_0010f4e0;
  pQVar7 = this_01;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(undefined8 *)pQVar7 = *puVar15;
    puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
    pQVar7 = pQVar7 + (ulong)bVar18 * -0x10 + 8;
  }
  *(ushort *)(this + 0xb0) = *(ushort *)(this + 0xb0) & 0xfc00;
  local_a8.size = 0xaaaaaaaaaaaaaaaa;
  local_a8.d._0_4_ = 0xaaaaaaaa;
  local_a8.d._4_4_ = 0xaaaaaaaa;
  local_a8.ptr._0_4_ = 0xaaaaaaaa;
  local_a8.ptr._4_4_ = 0xaaaaaaaa;
  QString::split(&local_a8,specification,0x3a,0,1);
  local_108 = 0xd05;
  uVar13 = 0;
  bVar4 = false;
  bVar3 = false;
  local_104 = 0;
  do {
    if ((ulong)local_a8.size <= uVar13) {
      if (local_104 != 0) {
        QTransform::fromTranslate(0.5,0.5);
        QTransform::rotate((double)local_104,(Axis)&local_88);
        pQVar7 = (QTuioHandler *)QTransform::translate(-0.5,-0.5);
        pQVar17 = this_01;
        for (lVar11 = 0x4a; lVar11 != 0; lVar11 = lVar11 + -1) {
          *pQVar17 = *pQVar7;
          pQVar7 = pQVar7 + (ulong)bVar18 * -2 + 1;
          pQVar17 = pQVar17 + (ulong)bVar18 * -2 + 1;
        }
      }
      if (bVar3) {
        QTransform::fromTranslate(0.5,0.5);
        QTransform::scale(-1.0,1.0);
        pQVar8 = (QTransform *)QTransform::translate(-0.5,-0.5);
        QTransform::operator*=((QTransform *)this_01,pQVar8);
      }
      if (bVar4) {
        QTransform::fromTranslate(0.5,0.5);
        QTransform::scale(1.0,-1.0);
        pQVar8 = (QTransform *)QTransform::translate(-0.5,-0.5);
        QTransform::operator*=((QTransform *)this_01,pQVar8);
      }
      pQVar9 = (QPointingDevice *)operator_new(0x10);
      qVar10 = QtPrivate::lengthHelperPointer<char>("TUIO");
      latin1.m_data = "TUIO";
      latin1.m_size = qVar10;
      QString::QString((QString *)&local_88,latin1);
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (char16_t *)0x0;
      local_c8.size = 0;
      QPointingDevice::QPointingDevice
                (pQVar9,&local_88,1,2,2,0x2b,0x10,0,&local_c8,0xffffffffffffffff,0);
      *(QPointingDevice **)(this + 0x10) = pQVar9;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QWindowSystemInterface::registerInputDevice(*(QInputDevice **)(this + 0x10));
      iVar5 = QUdpSocket::bind(this_00,4,(sockaddr *)(ulong)(ushort)local_108,0);
      if ((char)iVar5 == '\0') {
        lcTuioHandler();
        if (((byte)lcTuioHandler::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
            != 0) {
          local_88.d._0_4_ = 2;
          local_88.d._4_4_ = 0;
          local_88.ptr._0_4_ = 0;
          local_88.ptr._4_4_ = 0;
          local_88.size._0_4_ = 0;
          local_88.size._4_4_ = 0;
          local_70 = lcTuioHandler::category.name;
          QMessageLogger::warning();
          pQVar6 = QDebug::operator<<(&local_d0,"Failed to bind TUIO socket: ");
          QIODevice::errorString();
          QDebug::operator<<(pQVar6,(QString *)&local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
          QDebug::~QDebug(&local_d0);
        }
      }
      else {
        local_88.d._0_4_ = 0x10840e;
        local_88.d._4_4_ = 0;
        local_88.ptr._0_4_ = 0;
        local_88.ptr._4_4_ = 0;
        QObject::connect<void(QIODevice::*)(),void(QTuioHandler::*)()>
                  (local_d8,(offset_in_QIODevice_to_subr)this_00,(ContextType *)QIODevice::readyRead
                   ,(offset_in_QTuioHandler_to_subr *)0x0,(ConnectionType)this);
        QMetaObject::Connection::~Connection((Connection *)local_d8);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    lVar11 = CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_);
    QString::QString((QString *)&local_88,"udp=");
    CVar14 = (CaseSensitivity)&local_88;
    cVar1 = QString::startsWith((QString *)(lVar11 + lVar12),CVar14);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    pQVar16 = &local_88;
    if (cVar1 == '\0') {
      lVar11 = CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_);
      QString::QString((QString *)&local_88,"tcp=");
      cVar1 = QString::startsWith((QString *)(lVar11 + lVar12),CVar14);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      if (cVar1 != '\0') {
        local_c8.size = -0x5555555555555556;
        local_c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        QString::section((QString *)&local_c8,
                         (QString *)(CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_) + lVar12),
                         (QChar)0x3d,1,1,(SectionFlags)0x0);
        local_108 = QString::toInt((QString *)&local_c8,(bool *)0x0,10);
        lcTuioHandler();
        pQVar16 = &local_c8;
        if (((byte)lcTuioHandler::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
            != 0) {
          local_88.d._0_4_ = 2;
          local_88.d._4_4_ = 0;
          local_88.ptr._0_4_ = 0;
          local_88.ptr._4_4_ = 0;
          local_88.size._0_4_ = 0;
          local_88.size._4_4_ = 0;
          local_70 = lcTuioHandler::category.name;
          QMessageLogger::warning();
          pQVar6 = QDebug::operator<<(&local_d0,"TCP is not yet supported. Falling back to UDP on ")
          ;
          QDebug::operator<<(pQVar6,local_108);
          QDebug::~QDebug(&local_d0);
        }
        goto LAB_00108004;
      }
      bVar2 = comparesEqual((QString *)(CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_) + lVar12),
                            "invertx");
      if (bVar2) {
        bVar3 = true;
      }
      else {
        bVar2 = comparesEqual((QString *)(CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_) + lVar12),
                              "inverty");
        if (bVar2) {
          bVar4 = true;
        }
        else {
          lVar11 = CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_);
          QString::QString((QString *)&local_88,"rotate=");
          cVar1 = QString::startsWith((QString *)(lVar11 + lVar12),CVar14);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          if (cVar1 != '\0') {
            local_88.size._0_4_ = 0xaaaaaaaa;
            local_88.size._4_4_ = 0xaaaaaaaa;
            local_88.d._0_4_ = 0xaaaaaaaa;
            local_88.d._4_4_ = 0xaaaaaaaa;
            local_88.ptr._0_4_ = 0xaaaaaaaa;
            local_88.ptr._4_4_ = 0xaaaaaaaa;
            QString::section((QString *)&local_88,
                             (QString *)(CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_) + lVar12),
                             (QChar)0x3d,1,1,(SectionFlags)0x0);
            iVar5 = QString::toInt((QString *)&local_88,(bool *)0x0,10);
            if (((iVar5 == 0x5a) || (iVar5 == 0x10e)) || (iVar5 == 0xb4)) {
              local_104 = iVar5;
            }
            goto LAB_00108004;
          }
        }
      }
    }
    else {
      local_88.size._0_4_ = 0xaaaaaaaa;
      local_88.size._4_4_ = 0xaaaaaaaa;
      local_88.d._0_4_ = 0xaaaaaaaa;
      local_88.d._4_4_ = 0xaaaaaaaa;
      local_88.ptr._0_4_ = 0xaaaaaaaa;
      local_88.ptr._4_4_ = 0xaaaaaaaa;
      QString::section((QString *)&local_88,
                       (QString *)(CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_) + lVar12),
                       (QChar)0x3d,1,1,(SectionFlags)0x0);
      local_108 = QString::toInt((QString *)&local_88,(bool *)0x0,10);
LAB_00108004:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar16);
    }
    uVar13 = uVar13 + 1;
    lVar12 = lVar12 + 0x18;
  } while( true );
}

Assistant:

QTuioHandler::QTuioHandler(const QString &specification)
{
    QStringList args = specification.split(':');
    int portNumber = 3333;
    int rotationAngle = 0;
    bool invertx = false;
    bool inverty = false;

    for (int i = 0; i < args.size(); ++i) {
        if (args.at(i).startsWith("udp=")) {
            QString portString = args.at(i).section('=', 1, 1);
            portNumber = portString.toInt();
        } else if (args.at(i).startsWith("tcp=")) {
            QString portString = args.at(i).section('=', 1, 1);
            portNumber = portString.toInt();
            qCWarning(lcTuioHandler) << "TCP is not yet supported. Falling back to UDP on " << portNumber;
        } else if (args.at(i) == "invertx") {
            invertx = true;
        } else if (args.at(i) == "inverty") {
            inverty = true;
        } else if (args.at(i).startsWith("rotate=")) {
            QString rotateArg = args.at(i).section('=', 1, 1);
            int argValue = rotateArg.toInt();
            switch (argValue) {
            case 90:
            case 180:
            case 270:
                rotationAngle = argValue;
                break;
            default:
                break;
            }
        }
    }

    if (rotationAngle)
        m_transform = QTransform::fromTranslate(0.5, 0.5).rotate(rotationAngle).translate(-0.5, -0.5);

    if (invertx)
        m_transform *= QTransform::fromTranslate(0.5, 0.5).scale(-1.0, 1.0).translate(-0.5, -0.5);

    if (inverty)
        m_transform *= QTransform::fromTranslate(0.5, 0.5).scale(1.0, -1.0).translate(-0.5, -0.5);

    // not leaked, QPointingDevice cleans up registered devices itself
    // TODO register each device based on SOURCE, not just an all-purpose generic touchscreen
    // TODO define seats when multiple connections occur
    m_device = new QPointingDevice(QLatin1String("TUIO"), 1, QInputDevice::DeviceType::TouchScreen,
                                   QPointingDevice::PointerType::Finger,
                                   QInputDevice::Capability::Position |
                                   QInputDevice::Capability::Area |
                                   QInputDevice::Capability::Velocity |
                                   QInputDevice::Capability::NormalizedPosition,
                                   16, 0);
    QWindowSystemInterface::registerInputDevice(m_device);

    if (!m_socket.bind(QHostAddress::Any, portNumber)) {
        qCWarning(lcTuioHandler) << "Failed to bind TUIO socket: " << m_socket.errorString();
        return;
    }

    connect(&m_socket, &QUdpSocket::readyRead, this, &QTuioHandler::processPackets);
}